

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-from-text.cpp
# Opt level: O3

void __thiscall
yactfr::internal::JsonValBuilder::
_handleVal<std::vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
          (JsonValBuilder *this,TextLocation *loc,
          vector<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>,_std::allocator<std::unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>_>_>
          *args)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer p_Var2;
  TextLocation loc_00;
  undefined8 uVar3;
  _Head_base<0UL,_const_yactfr::internal::JsonArrayVal_*,_false> _Var4;
  Up jsonVal;
  undefined1 local_60 [16];
  pointer local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  _Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false> local_38;
  TextLocation local_30;
  
  TextLocation::TextLocation
            (&local_30,this->_baseOffset + loc->_offset,loc->_lineNumber,loc->_colNumber);
  loc_00._lineNumber = local_30._lineNumber;
  loc_00._offset = local_30._offset;
  loc_00._colNumber = local_30._colNumber;
  createJsonVal((Container *)local_60,loc_00);
  uVar3 = local_60._0_8_;
  p_Var2 = (this->_stack).
           super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if ((this->_stack).
      super__Vector_base<yactfr::internal::JsonValBuilder::_tStackFrame,_std::allocator<yactfr::internal::JsonValBuilder::_tStackFrame>_>
      ._M_impl.super__Vector_impl_data._M_start == p_Var2) {
    local_60._0_8_ = (_Head_base<0UL,_const_yactfr::internal::JsonArrayVal_*,_false>)0x0;
    _Var4._M_head_impl =
         (JsonArrayVal *)
         (this->_jsonVal)._M_t.
         super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
         ._M_t.
         super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
         .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl;
    (this->_jsonVal)._M_t.
    super___uniq_ptr_impl<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
    ._M_t.
    super__Tuple_impl<0UL,_const_yactfr::internal::JsonVal_*,_std::default_delete<const_yactfr::internal::JsonVal>_>
    .super__Head_base<0UL,_const_yactfr::internal::JsonVal_*,_false>._M_head_impl = (JsonVal *)uVar3
    ;
  }
  else {
    if (p_Var2[-1].state == InObj) {
      local_60._8_8_ = p_Var2[-1].lastObjKey._M_dataplus._M_p;
      paVar1 = &p_Var2[-1].lastObjKey.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._8_8_ == paVar1) {
        local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
        local_48._8_8_ = *(undefined8 *)((long)&p_Var2[-1].lastObjKey.field_2 + 8);
        local_60._8_8_ = &local_48;
      }
      else {
        local_48._M_allocated_capacity = paVar1->_M_allocated_capacity;
      }
      local_50 = (pointer)p_Var2[-1].lastObjKey._M_string_length;
      p_Var2[-1].lastObjKey._M_dataplus._M_p = (pointer)paVar1;
      p_Var2[-1].lastObjKey._M_string_length = 0;
      p_Var2[-1].lastObjKey.field_2._M_local_buf[0] = '\0';
      local_38._M_head_impl = (JsonVal *)local_60._0_8_;
      local_60._0_8_ =
           (__uniq_ptr_impl<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>
            )0x0;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
      ::
      _M_emplace_unique<std::pair<std::__cxx11::string,std::unique_ptr<yactfr::internal::JsonArrayVal_const,std::default_delete<yactfr::internal::JsonArrayVal_const>>>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>>
                  *)&p_Var2[-1].objValCont,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>_>
                  *)(local_60 + 8));
      std::
      unique_ptr<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>
      ::~unique_ptr((unique_ptr<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>
                     *)&local_38);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._8_8_ != &local_48) {
        operator_delete((void *)local_60._8_8_,local_48._M_allocated_capacity + 1);
      }
      goto LAB_0021b278;
    }
    if (p_Var2[-1].state != InArray) {
      abort();
    }
    local_60._0_8_ =
         (__uniq_ptr_impl<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>
          )0x0;
    local_60._8_8_ = uVar3;
    std::
    vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>
    ::
    emplace_back<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>
              ((vector<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>,std::allocator<std::unique_ptr<yactfr::internal::JsonVal_const,std::default_delete<yactfr::internal::JsonVal_const>>>>
                *)&p_Var2[-1].arrayValCont,
               (unique_ptr<const_yactfr::internal::JsonVal,_std::default_delete<const_yactfr::internal::JsonVal>_>
                *)(local_60 + 8));
    _Var4._M_head_impl = (JsonArrayVal *)local_60._8_8_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)&(_Var4._M_head_impl)->super_JsonVal + 8))();
  }
LAB_0021b278:
  std::
  unique_ptr<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>
  ::~unique_ptr((unique_ptr<const_yactfr::internal::JsonArrayVal,_std::default_delete<const_yactfr::internal::JsonArrayVal>_>
                 *)local_60);
  return;
}

Assistant:

void _handleVal(const TextLocation& loc, ArgTs&&... args)
    {
        auto jsonVal = createJsonVal(std::forward<ArgTs>(args)..., TextLocation {
            loc.offset() + _baseOffset, loc.lineNumber(), loc.columnNumber()
        });

        if (_stack.empty()) {
            _jsonVal = std::move(jsonVal);
            return;
        }

        switch (_stack.back().state) {
        case _tState::InArray:
            this->_stackTop().arrayValCont.push_back(std::move(jsonVal));
            break;

        case _tState::InObj:
             // safe to move `lastObjKey`: only used once
            this->_stackTop().objValCont.insert(std::make_pair(std::move(this->_stackTop().lastObjKey),
                                                               std::move(jsonVal)));
            break;

        default:
            std::abort();
        }
    }